

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::initializeMapBuilder
          (CoreBroker *this,string_view request,uint16_t index,QueryReuse reuse,bool force_ordering)

{
  _Tuple_impl<2UL,_helics::QueryReuse> *p_Var1;
  json_value jVar2;
  pointer pBVar3;
  BaseTimeCoordinator *pBVar4;
  undefined8 uVar5;
  _Hash_node_base *__src;
  bool bVar6;
  int iVar7;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar8;
  reference pvVar9;
  ulong uVar10;
  string *psVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  _Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
  _Var12;
  value_t vVar13;
  undefined6 in_register_0000000a;
  CoreBroker *pCVar14;
  undefined1 *puVar15;
  JsonMapBuilder *pJVar16;
  action_t startingAction;
  size_t size;
  data *this_00;
  GlobalFederateId *dep;
  pointer val;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar17;
  _Hash_node_base *p_Var18;
  pointer *ppbVar19;
  UnknownHandleManager *this_01;
  json brkstate;
  json aliasSet;
  ActionMessage queryReq;
  undefined1 local_2f8 [16];
  code *local_2e8;
  code *pcStack_2e0;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_2d0;
  CoreBroker *local_2c8;
  _Hash_node_base *local_2c0;
  _Hash_node_base *local_2b8;
  JsonMapBuilder *local_2b0;
  data local_2a8;
  data local_298;
  data local_288;
  data local_270;
  data local_260;
  data local_250;
  data local_240;
  data local_230;
  data local_220;
  data local_210;
  data local_200;
  ulong local_1f0;
  data local_1e8;
  key_type local_1d8;
  data local_1b8;
  data local_1a8;
  data local_198;
  data local_188;
  data local_178;
  data local_168;
  data local_158;
  data local_148;
  data local_138;
  data local_128;
  data local_118;
  data local_108;
  data local_f8;
  ActionMessage local_e8;
  
  local_2c0 = (_Hash_node_base *)request._M_str;
  size = request._M_len;
  if ((((uint)(*(int *)&(this->mapBuilders).
                        super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
              *(int *)&(this->mapBuilders).
                       super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555 & 0xffff) <=
      (uint)CONCAT62(in_register_0000000a,index)) {
    std::
    vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
    ::resize((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
              *)&this->mapBuilders,(ulong)index + 1);
  }
  p_Var1 = &(((this->mapBuilders).
              super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            ).
            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            .super__Tuple_impl<2UL,_helics::QueryReuse> + ((uint)index * 2 + (uint)index) * 0x20;
  pJVar16 = (JsonMapBuilder *)(p_Var1 + 0x20);
  (p_Var1->super__Head_base<2UL,_helics::QueryReuse,_false>)._M_head_impl = reuse;
  local_1f0 = (ulong)index;
  fileops::JsonMapBuilder::reset(pJVar16);
  local_2b0 = pJVar16;
  pbVar8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)fileops::JsonMapBuilder::getJValue_abi_cxx11_(pJVar16);
  local_2c8 = this;
  BrokerBase::addBaseInformation
            (&this->super_BrokerBase,(json *)pbVar8,(bool)((this->super_BrokerBase).field_0x294 ^ 1)
            );
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_f8,(initializer_list_t)ZEXT816(0),false,array);
  local_2d0 = pbVar8;
  pvVar9 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>(pbVar8,"brokers");
  vVar13 = (pvVar9->m_data).m_type;
  (pvVar9->m_data).m_type = local_f8.m_type;
  jVar2 = (pvVar9->m_data).m_value;
  (pvVar9->m_data).m_value = local_f8.m_value;
  local_f8.m_type = vVar13;
  local_f8.m_value = jVar2;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_f8);
  startingAction = cmd_broker_query;
  if (force_ordering) {
    startingAction = cmd_broker_query_ordered;
  }
  ActionMessage::ActionMessage(&local_e8,startingAction);
  __src = local_2c0;
  pCVar14 = local_2c8;
  if (index == 8) {
    ActionMessage::setAction(&local_e8,cmd_broker_query_ordered);
  }
  local_e8.payload.bufferSize = size;
  if (((_Hash_node_base *)local_e8.payload.heap != __src) &&
     (SmallBuffer::reserve(&local_e8.payload,size), size != 0)) {
    memcpy(local_e8.payload.heap,__src,size);
  }
  pJVar16 = local_2b0;
  local_e8.source_id.gid = (pCVar14->super_BrokerBase).global_broker_id_local.gid;
  val = (pCVar14->mBrokers).dataStorage.
        super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pBVar3 = (pCVar14->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_e8.counter = index;
  if (val != pBVar3) {
    local_2c0 = (_Hash_node_base *)0x0;
    local_2b8 = (_Hash_node_base *)0x0;
    do {
      if ((val->parent).gid == (local_2c8->super_BrokerBase).global_broker_id_local.gid) {
        uVar10 = (ulong)val->state;
        if (uVar10 < 0x33) {
          if ((7UL >> (uVar10 & 0x3f) & 1) == 0) {
            if (((0x5010000000000U >> (uVar10 & 0x3f) & 1) != 0) && (index == 6)) {
              local_2f8._0_8_ = local_2f8._0_8_ & 0xffffffffffffff00;
              local_2f8._8_8_ =
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)0x0;
              psVar11 = stateString_abi_cxx11_(val->state);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_230,psVar11);
              pvVar9 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2f8,"state");
              vVar13 = (pvVar9->m_data).m_type;
              (pvVar9->m_data).m_type = local_230.m_type;
              jVar2 = (pvVar9->m_data).m_value;
              (pvVar9->m_data).m_value = local_230.m_value;
              local_230.m_type = vVar13;
              local_230.m_value = jVar2;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_230);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_240,(initializer_list_t)ZEXT816(0),false,object);
              pvVar9 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                   *)local_2f8,"attributes");
              vVar13 = (pvVar9->m_data).m_type;
              (pvVar9->m_data).m_type = local_240.m_type;
              jVar2 = (pvVar9->m_data).m_value;
              (pvVar9->m_data).m_value = local_240.m_value;
              local_240.m_type = vVar13;
              local_240.m_value = jVar2;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_240);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_250,&val->name);
              pbVar8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)local_2f8,"attributes");
              pvVar9 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>(pbVar8,"name");
              vVar13 = (pvVar9->m_data).m_type;
              (pvVar9->m_data).m_type = local_250.m_type;
              jVar2 = (pvVar9->m_data).m_value;
              (pvVar9->m_data).m_value = local_250.m_value;
              local_250.m_type = vVar13;
              local_250.m_value = jVar2;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_250);
              local_288.m_type = null;
              local_288._1_7_ = 0;
              local_288.m_value.object = (object_t *)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
              construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_288,(long)(val->global_id).gid);
              pbVar8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)local_2f8,"attributes");
              pvVar9 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>(pbVar8,"id");
              vVar13 = (pvVar9->m_data).m_type;
              (pvVar9->m_data).m_type = local_288.m_type;
              local_288.m_type = vVar13;
              jVar2 = (pvVar9->m_data).m_value;
              (pvVar9->m_data).m_value.object = (object_t *)local_288.m_value;
              local_288.m_value = jVar2;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_288);
              local_298.m_type = null;
              local_298._1_7_ = 0;
              local_298.m_value.object = (object_t *)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
              construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_298,(long)(val->parent).gid);
              pbVar8 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                      *)local_2f8,"attributes");
              pvVar9 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>(pbVar8,"parent");
              vVar13 = (pvVar9->m_data).m_type;
              (pvVar9->m_data).m_type = local_298.m_type;
              local_298.m_type = vVar13;
              jVar2 = (pvVar9->m_data).m_value;
              (pvVar9->m_data).m_value.object = (object_t *)local_298.m_value;
              local_298.m_value = jVar2;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_298);
              if (val->_core == true) {
                if (((ulong)local_2c0 & 1) == 0) {
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_260,(initializer_list_t)ZEXT816(0),false,array);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>(local_2d0,"cores");
                  vVar13 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_260.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_260.m_value;
                  local_260.m_type = vVar13;
                  local_260.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_260);
                  local_2c0 = (_Hash_node_base *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(local_2d0,"cores");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)local_2f8);
              }
              else {
                if (((ulong)local_2b8 & 1) == 0) {
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_270,(initializer_list_t)ZEXT816(0),false,array);
                  pvVar9 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>(local_2d0,"brokers");
                  vVar13 = (pvVar9->m_data).m_type;
                  (pvVar9->m_data).m_type = local_270.m_type;
                  jVar2 = (pvVar9->m_data).m_value;
                  (pvVar9->m_data).m_value = local_270.m_value;
                  local_270.m_type = vVar13;
                  local_270.m_value = jVar2;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::data::~data(&local_270);
                  local_2b8 = (_Hash_node_base *)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
                }
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(local_2d0,"brokers");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)local_2f8);
              }
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)local_2f8);
            }
          }
          else {
            if (val->_core == true) {
              if (((ulong)local_2c0 & 1) == 0) {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_210,(initializer_list_t)ZEXT816(0),false,array);
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(local_2d0,"cores");
                vVar13 = (pvVar9->m_data).m_type;
                (pvVar9->m_data).m_type = local_210.m_type;
                jVar2 = (pvVar9->m_data).m_value;
                (pvVar9->m_data).m_value = local_210.m_value;
                local_210.m_type = vVar13;
                local_210.m_value = jVar2;
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(&local_210);
                local_2c0 = (_Hash_node_base *)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
              }
              local_2f8._0_8_ = &local_2e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"cores","");
              iVar7 = fileops::JsonMapBuilder::generatePlaceHolder
                                (pJVar16,(string *)local_2f8,(val->global_id).gid);
            }
            else {
              if (((ulong)local_2b8 & 1) == 0) {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_220,(initializer_list_t)ZEXT816(0),false,array);
                pvVar9 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         ::operator[]<char_const>(local_2d0,"brokers");
                vVar13 = (pvVar9->m_data).m_type;
                (pvVar9->m_data).m_type = local_220.m_type;
                jVar2 = (pvVar9->m_data).m_value;
                (pvVar9->m_data).m_value = local_220.m_value;
                local_220.m_type = vVar13;
                local_220.m_value = jVar2;
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(&local_220);
                local_2b8 = (_Hash_node_base *)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
              }
              local_2f8._0_8_ = &local_2e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"brokers","");
              iVar7 = fileops::JsonMapBuilder::generatePlaceHolder
                                (pJVar16,(string *)local_2f8,(val->global_id).gid);
            }
            if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)local_2f8._0_8_ !=
                (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)&local_2e8) {
              operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
            }
            local_e8.dest_id.gid = (val->global_id).gid;
            local_e8.messageID = iVar7;
            (*(local_2c8->super_Broker)._vptr_Broker[0x22])
                      (local_2c8,(ulong)(uint)(val->route).rid,&local_e8);
          }
        }
      }
      val = val + 1;
    } while (val != pBVar3);
  }
  pCVar14 = local_2c8;
  pbVar8 = local_2d0;
  switch((int)local_1f0) {
  case 3:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_108,(initializer_list_t)ZEXT816(0),false,array);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar8,"dependents");
    vVar13 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_108.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_108.m_value;
    local_108.m_type = vVar13;
    local_108.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_108);
    BaseTimeCoordinator::getDependents
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               local_2f8,
               (pCVar14->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    uVar5 = local_2f8._8_8_;
    if (local_2f8._0_8_ != local_2f8._8_8_) {
      pbVar17 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)local_2f8._0_8_;
      do {
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar8,"dependents");
        local_2a8.m_type = null;
        local_2a8._1_7_ = 0;
        local_2a8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_2a8,(long)*(int *)pbVar17);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_2a8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_2a8);
        pbVar17 = pbVar17 + 4;
      } while (pbVar17 !=
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)uVar5);
    }
    if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)local_2f8._0_8_ !=
        (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)0x0) {
      operator_delete((void *)local_2f8._0_8_,(long)local_2e8 - local_2f8._0_8_);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_118,(initializer_list_t)ZEXT816(0),false,array);
    pCVar14 = local_2c8;
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar8,"dependencies");
    vVar13 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_118.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_118.m_value;
    local_118.m_type = vVar13;
    local_118.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_118);
    BaseTimeCoordinator::getDependencies
              ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
               local_2f8,
               (pCVar14->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    uVar5 = local_2f8._8_8_;
    if (local_2f8._0_8_ != local_2f8._8_8_) {
      pbVar17 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)local_2f8._0_8_;
      do {
        pvVar9 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar8,"dependencies");
        local_2a8.m_type = null;
        local_2a8._1_7_ = 0;
        local_2a8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_2a8,(long)*(int *)pbVar17);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_2a8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_2a8);
        pbVar17 = pbVar17 + 4;
      } while (pbVar17 !=
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)uVar5);
    }
    if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)local_2f8._0_8_ !=
        (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         *)0x0) {
      operator_delete((void *)local_2f8._0_8_,(long)local_2e8 - local_2f8._0_8_);
    }
    break;
  case 5:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json<const_char_*const_&,_const_char_*,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_128,(char **)&versionString);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar8,"version");
    vVar13 = (pvVar9->m_data).m_type;
    this_00 = &local_128;
    goto LAB_0034952c;
  case 6:
    psVar11 = brokerStateName_abi_cxx11_((local_2c8->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_138,psVar11);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar8,"state");
    vVar13 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_138.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_138.m_value;
    local_138.m_type = vVar13;
    local_138.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_138);
    local_1b8.m_type = null;
    local_1b8._1_7_ = 0;
    local_1b8.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)4>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_1b8,
               (ushort)((pCVar14->super_BrokerBase).brokerState._M_i + CONNECTED_ERROR) < 7);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar8,"status");
    vVar13 = (pvVar9->m_data).m_type;
    this_00 = &local_1b8;
LAB_0034952c:
    (pvVar9->m_data).m_type = this_00->m_type;
    this_00->m_type = vVar13;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = this_00->m_value;
    this_00->m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(this_00);
    break;
  case 7:
    psVar11 = brokerStateName_abi_cxx11_((local_2c8->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_148,psVar11);
    pvVar9 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>(pbVar8,"state");
    vVar13 = (pvVar9->m_data).m_type;
    (pvVar9->m_data).m_type = local_148.m_type;
    jVar2 = (pvVar9->m_data).m_value;
    (pvVar9->m_data).m_value = local_148.m_value;
    local_148.m_type = vVar13;
    local_148.m_value = jVar2;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_148);
    pBVar4 = (pCVar14->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    if ((pBVar4 != (BaseTimeCoordinator *)0x0) &&
       (*(pointer *)
         &(pBVar4->dependencies).dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
        (pBVar4->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      local_1e8.m_type = null;
      local_1e8.m_value.object = (object_t *)0x0;
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar8,"time");
      vVar13 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_1e8.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value.object = (object_t *)local_1e8.m_value;
      local_1e8.m_type = vVar13;
      local_1e8.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1e8);
      pBVar4 = (pCVar14->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar8,"time");
      (*pBVar4->_vptr_BaseTimeCoordinator[0xc])(pBVar4,pvVar9);
    }
    break;
  case 0xe:
    if ((local_2c8->global_values)._M_h._M_element_count != 0) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)local_2f8,(initializer_list_t)ZEXT816(0),false,object);
      p_Var18 = (pCVar14->global_values)._M_h._M_before_begin._M_nxt;
      if (p_Var18 != (_Hash_node_base *)0x0) {
        do {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var18 + 5));
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,p_Var18[1]._M_nxt,
                     (long)&(p_Var18[2]._M_nxt)->_M_nxt + (long)p_Var18[1]._M_nxt);
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)local_2f8,&local_1d8);
          vVar13 = (pvVar9->m_data).m_type;
          (pvVar9->m_data).m_type = local_200.m_type;
          jVar2 = (pvVar9->m_data).m_value;
          (pvVar9->m_data).m_value = local_200.m_value;
          local_200.m_type = vVar13;
          local_200.m_value = jVar2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_200);
          p_Var18 = p_Var18->_M_nxt;
        } while (p_Var18 != (_Hash_node_base *)0x0);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_158,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)local_2f8);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar8,"tags");
      pCVar14 = local_2c8;
      vVar13 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_158.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_158.m_value;
      local_158.m_type = vVar13;
      local_158.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_158);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)local_2f8);
    }
    if ((pCVar14->handles).aliases._M_h._M_element_count != 0) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_168,(initializer_list_t)ZEXT816(0),false,array);
      pCVar14 = local_2c8;
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(local_2d0,"aliases");
      vVar13 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_168.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_168.m_value;
      local_168.m_type = vVar13;
      local_168.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_168);
      _Var12._M_head_impl =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            *)(pCVar14->handles).aliases._M_h._M_before_begin._M_nxt;
      if ((JsonMapBuilder *)_Var12._M_head_impl != (JsonMapBuilder *)0x0) {
        do {
          ppbVar19 = (pointer *)
                     ((json_value *)
                     &(((JsonMapBuilder *)_Var12._M_head_impl)->missing_components)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_parent)->array;
          local_2c0 = (_Hash_node_base *)
                      (((JsonMapBuilder *)_Var12._M_head_impl)->missing_components)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
          local_2b0 = (JsonMapBuilder *)_Var12._M_head_impl;
          if ((_Hash_node_base *)ppbVar19 != local_2c0) {
            local_2b8 = *(_Hash_node_base **)
                         &(((JsonMapBuilder *)_Var12._M_head_impl)->missing_components)._M_t._M_impl
                          .super__Rb_tree_header._M_header;
            puVar15 = &((*(object_t **)&((JsonMapBuilder *)_Var12._M_head_impl)->missing_components)
                       ->_M_t)._M_impl.field_0x0 + (long)local_2b8;
            do {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_2a8,(initializer_list_t)ZEXT816(0),false,array);
              local_2f8._0_8_ =
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)&local_2e8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,local_2b8,puVar15)
              ;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&local_2a8,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&local_178);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_178);
              if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)local_2f8._0_8_ !=
                  (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)&local_2e8) {
                operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
              }
              local_2f8._0_8_ =
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    *)&local_2e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2f8,(_Hash_node_base *)ppbVar19[1],
                         (long)&((_Hash_node_base *)*ppbVar19)->_M_nxt + (long)ppbVar19[1]);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&local_2a8,
                          (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)&local_178);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_178);
              if ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)local_2f8._0_8_ !=
                  (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   *)&local_2e8) {
                operator_delete((void *)local_2f8._0_8_,(ulong)((long)local_2e8 + 1));
              }
              pvVar9 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>(local_2d0,"aliases");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::push_back(pvVar9,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&local_2a8);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_2a8);
              ppbVar19 = ppbVar19 + 2;
            } while ((_Hash_node_base *)ppbVar19 != local_2c0);
          }
          _Var12._M_head_impl =
               (local_2b0->jMap)._M_t.
               super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               .
               super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
               ._M_head_impl;
        } while (_Var12._M_head_impl !=
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)0x0);
      }
    }
    this_01 = &local_2c8->unknownHandles;
    bVar6 = UnknownHandleManager::hasUnknowns(this_01);
    pbVar8 = local_2d0;
    if (bVar6) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_188,(initializer_list_t)ZEXT816(0),false,array);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar8,"unknown_publications");
      vVar13 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_188.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_188.m_value;
      local_188.m_type = vVar13;
      local_188.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_188);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_198,(initializer_list_t)ZEXT816(0),false,array);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar8,"unknown_inputs");
      vVar13 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_198.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_198.m_value;
      local_198.m_type = vVar13;
      local_198.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_198);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1a8,(initializer_list_t)ZEXT816(0),false,array);
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar8,"unknown_endpoints");
      vVar13 = (pvVar9->m_data).m_type;
      (pvVar9->m_data).m_type = local_1a8.m_type;
      jVar2 = (pvVar9->m_data).m_value;
      (pvVar9->m_data).m_value = local_1a8.m_value;
      local_1a8.m_type = vVar13;
      local_1a8.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1a8);
      local_2f8._8_8_ = (object_t *)0x0;
      local_2f8._0_8_ = pbVar8;
      pcStack_2e0 = CLI::std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:4103:41)>
                    ::_M_invoke;
      local_2e8 = CLI::std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:4103:41)>
                  ::_M_manager;
      UnknownHandleManager::processUnknowns
                (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
                          *)local_2f8);
      if (local_2e8 != (code *)0x0) {
        (*local_2e8)(local_2f8,local_2f8,3);
      }
      local_2f8._8_8_ =
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)0x0;
      local_2f8._0_8_ = pbVar8;
      pcStack_2e0 = CLI::std::
                    _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:4121:45)>
                    ::_M_invoke;
      local_2e8 = CLI::std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:4121:45)>
                  ::_M_manager;
      UnknownHandleManager::processUnknownLinks
                (this_01,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
                          *)local_2f8);
      if (local_2e8 != (code *)0x0) {
        (*local_2e8)(local_2f8,local_2f8,3);
      }
    }
  }
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CoreBroker::initializeMapBuilder(std::string_view request,
                                      std::uint16_t index,
                                      QueryReuse reuse,
                                      bool force_ordering)
{
    if (!isValidIndex(index, mapBuilders)) {
        mapBuilders.resize(static_cast<size_t>(index) + 1);
    }
    std::get<2>(mapBuilders[index]) = reuse;
    auto& builder = std::get<0>(mapBuilders[index]);
    builder.reset();
    nlohmann::json& base = builder.getJValue();
    addBaseInformation(base, !isRootc);
    base["brokers"] = nlohmann::json::array();
    ActionMessage queryReq(force_ordering ? CMD_BROKER_QUERY_ORDERED : CMD_BROKER_QUERY);
    if (index == GLOBAL_FLUSH) {
        queryReq.setAction(CMD_BROKER_QUERY_ORDERED);
    }
    queryReq.payload = request;
    queryReq.source_id = global_broker_id_local;
    queryReq.counter = index;  // indicating which processing to use
    bool hasCores = false;
    bool hasBrokers = false;
    for (const auto& broker : mBrokers) {
        if (broker.parent == global_broker_id_local) {
            switch (broker.state) {
                case ConnectionState::CONNECTED:
                case ConnectionState::INIT_REQUESTED:
                case ConnectionState::OPERATING: {
                    int brkindex;
                    if (broker._core) {
                        if (!hasCores) {
                            hasCores = true;
                            base["cores"] = nlohmann::json::array();
                        }
                        brkindex =
                            builder.generatePlaceHolder("cores", broker.global_id.baseValue());
                    } else {
                        if (!hasBrokers) {
                            hasBrokers = true;
                            base["brokers"] = nlohmann::json::array();
                        }
                        brkindex =
                            builder.generatePlaceHolder("brokers", broker.global_id.baseValue());
                    }
                    queryReq.messageID = brkindex;
                    queryReq.dest_id = broker.global_id;
                    transmit(broker.route, queryReq);
                } break;
                case ConnectionState::ERROR_STATE:
                case ConnectionState::DISCONNECTED:
                case ConnectionState::REQUEST_DISCONNECT:
                    if (index == GLOBAL_STATE) {
                        nlohmann::json brkstate;
                        brkstate["state"] = stateString(broker.state);
                        brkstate["attributes"] = nlohmann::json::object();
                        brkstate["attributes"]["name"] = broker.name;
                        brkstate["attributes"]["id"] = broker.global_id.baseValue();
                        brkstate["attributes"]["parent"] = broker.parent.baseValue();
                        if (broker._core) {
                            if (!hasCores) {
                                base["cores"] = nlohmann::json::array();
                                hasCores = true;
                            }
                            base["cores"].push_back(std::move(brkstate));
                        } else {
                            if (!hasBrokers) {
                                base["brokers"] = nlohmann::json::array();
                                hasBrokers = true;
                            }
                            base["brokers"].push_back(std::move(brkstate));
                        }
                    }
                    break;
            }
        }
    }
    switch (index) {
        case FEDERATE_MAP:
        case CURRENT_TIME_MAP:
        case GLOBAL_STATUS:
        case DATA_FLOW_GRAPH:
        case GLOBAL_FLUSH:
        default:
            break;
        case DEPENDENCY_GRAPH: {
            base["dependents"] = nlohmann::json::array();
            for (const auto& dep : timeCoord->getDependents()) {
                base["dependents"].push_back(dep.baseValue());
            }
            base["dependencies"] = nlohmann::json::array();
            for (const auto& dep : timeCoord->getDependencies()) {
                base["dependencies"].push_back(dep.baseValue());
            }
        } break;
        case VERSION_ALL:
            base["version"] = versionString;
            break;
        case GLOBAL_STATE:
            base["state"] = brokerStateName(getBrokerState());
            base["status"] = isConnected();
            break;
        case GLOBAL_TIME_DEBUGGING:
            base["state"] = brokerStateName(getBrokerState());
            if (timeCoord && !timeCoord->empty()) {
                base["time"] = nlohmann::json();
                timeCoord->generateDebuggingTimeInfo(base["time"]);
            }
            break;
        case UNCONNECTED_INTERFACES:
            if (!global_values.empty()) {
                nlohmann::json tagBlock = nlohmann::json::object();
                for (const auto& global : global_values) {
                    tagBlock[global.first] = global.second;
                }
                base["tags"] = tagBlock;
            }
            const auto& aliases = handles.getAliases();
            if (!aliases.empty()) {
                base["aliases"] = nlohmann::json::array();
                for (const auto& alias : aliases) {
                    const std::string_view interfaceName = alias.first;
                    const auto& aliasNames = alias.second;
                    for (const auto& aliasName : aliasNames) {
                        nlohmann::json aliasSet = nlohmann::json::array();
                        aliasSet.push_back(std::string(interfaceName));
                        aliasSet.push_back(std::string(aliasName));
                        base["aliases"].push_back(std::move(aliasSet));
                    }
                }
            }
            if (unknownHandles.hasUnknowns()) {
                base["unknown_publications"] = nlohmann::json::array();
                base["unknown_inputs"] = nlohmann::json::array();
                base["unknown_endpoints"] = nlohmann::json::array();
                auto unknownProcessor = [&base](const std::string& name,
                                                InterfaceType type,
                                                UnknownHandleManager::TargetInfo /*target*/) {
                    switch (type) {
                        case InterfaceType::INPUT:
                            base["unknown_inputs"].push_back(name);
                            break;
                        case InterfaceType::PUBLICATION:
                            base["unknown_publications"].push_back(name);
                            break;
                        case InterfaceType::ENDPOINT:
                            base["unknown_endpoints"].push_back(name);
                            break;
                        default:
                            break;
                    }
                };
                unknownHandles.processUnknowns(unknownProcessor);
                auto unknownLinkProcessor = [&base](const std::string& origin,
                                                    InterfaceType type1,
                                                    const std::string& target,
                                                    InterfaceType type2) {
                    switch (type2) {
                        case InterfaceType::INPUT:
                            base["unknown_inputs"].push_back(target);
                            base["unknown_publications"].push_back(origin);
                            break;
                        case InterfaceType::ENDPOINT:
                            base["unknown_endpoints"].push_back(target);
                            if (type1 == InterfaceType::ENDPOINT) {
                                base["unknown_endpoints"].push_back(origin);
                            }
                            break;
                        default:
                            break;
                    }
                };
                unknownHandles.processUnknownLinks(unknownLinkProcessor);
            }
            break;
    }
}